

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_noise_model_init(aom_noise_model_t *model,aom_noise_model_params_t params)

{
  int iVar1;
  int (*paiVar2) [2];
  int iVar3;
  int iVar4;
  aom_noise_state_t *state;
  int iVar5;
  int iVar6;
  uint bit_depth;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar8 = params._0_8_;
  uVar7 = params.lag;
  if (params.shape == '\x01') {
    iVar1 = uVar7 * 2 + 1;
    uVar9 = (uint)(iVar1 * iVar1) >> 1;
  }
  else {
    uVar9 = 0;
    if (((undefined1  [16])params & (undefined1  [16])0xff) == (undefined1  [16])0x0) {
      uVar9 = (uVar7 + 1) * uVar7;
    }
  }
  iVar1 = 0;
  memset(model,0,0x2c0);
  if (uVar7 == 0 || (long)uVar8 < 0) {
    fprintf(_stderr,"Invalid noise param: lag = %d must be >= 1\n",uVar8 >> 0x20);
  }
  else if (uVar7 < 5) {
    iVar1 = 0;
    bit_depth = params.bit_depth;
    if ((bit_depth < 0xd) && ((0x1500U >> (bit_depth & 0x1f) & 1) != 0)) {
      (model->params).shape = (char)uVar8;
      *(int3 *)&(model->params).field_0x1 = (int3)(uVar8 >> 8);
      (model->params).lag = (int)(uVar8 >> 0x20);
      (model->params).bit_depth = (int)params._8_8_;
      (model->params).use_highbd = (int)((ulong)params._8_8_ >> 0x20);
      state = model->latest_state;
      for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
        iVar4 = (uVar9 + 1) - (uint)(uVar8 == 0);
        iVar1 = noise_state_init(state + -3,iVar4,bit_depth);
        if ((iVar1 == 0) || (iVar1 = noise_state_init(state,iVar4,bit_depth), iVar1 == 0)) {
          fprintf(_stderr,"Failed to allocate noise state for channel %d\n",uVar8 & 0xffffffff);
          aom_noise_model_free(model);
          return 0;
        }
        state = state + 1;
      }
      model->n = uVar9;
      paiVar2 = (int (*) [2])aom_malloc((long)(int)uVar9 << 3);
      model->coords = paiVar2;
      if (paiVar2 == (int (*) [2])0x0) {
LAB_0025030d:
        aom_noise_model_free(model);
        iVar1 = 0;
      }
      else {
        iVar3 = 0;
        iVar1 = 1;
        for (iVar4 = -uVar7; iVar4 < 1; iVar4 = iVar4 + 1) {
          for (iVar5 = -uVar7; iVar5 <= (int)(-(uint)(iVar4 == 0) | uVar7); iVar5 = iVar5 + 1) {
            if (params.shape == '\x01') {
LAB_002502db:
              paiVar2[iVar3][0] = iVar5;
              paiVar2[iVar3][1] = iVar4;
              iVar3 = iVar3 + 1;
            }
            else {
              if (((undefined1  [16])params & (undefined1  [16])0xff) != (undefined1  [16])0x0) {
                fwrite("Invalid shape\n",0xe,1,_stderr);
                goto LAB_0025030d;
              }
              iVar6 = -iVar5;
              if (0 < iVar5) {
                iVar6 = iVar5;
              }
              if (iVar6 <= (int)(iVar4 + uVar7)) goto LAB_002502db;
            }
          }
        }
      }
    }
  }
  else {
    iVar1 = 0;
    fprintf(_stderr,"Invalid noise param: lag = %d must be <= %d\n",uVar8 >> 0x20,4);
  }
  return iVar1;
}

Assistant:

int aom_noise_model_init(aom_noise_model_t *model,
                         const aom_noise_model_params_t params) {
  const int n = num_coeffs(params);
  const int lag = params.lag;
  const int bit_depth = params.bit_depth;
  int x = 0, y = 0, i = 0, c = 0;

  memset(model, 0, sizeof(*model));
  if (params.lag < 1) {
    fprintf(stderr, "Invalid noise param: lag = %d must be >= 1\n", params.lag);
    return 0;
  }
  if (params.lag > kMaxLag) {
    fprintf(stderr, "Invalid noise param: lag = %d must be <= %d\n", params.lag,
            kMaxLag);
    return 0;
  }
  if (!(params.bit_depth == 8 || params.bit_depth == 10 ||
        params.bit_depth == 12)) {
    return 0;
  }

  memcpy(&model->params, &params, sizeof(params));
  for (c = 0; c < 3; ++c) {
    if (!noise_state_init(&model->combined_state[c], n + (c > 0), bit_depth)) {
      fprintf(stderr, "Failed to allocate noise state for channel %d\n", c);
      aom_noise_model_free(model);
      return 0;
    }
    if (!noise_state_init(&model->latest_state[c], n + (c > 0), bit_depth)) {
      fprintf(stderr, "Failed to allocate noise state for channel %d\n", c);
      aom_noise_model_free(model);
      return 0;
    }
  }
  model->n = n;
  model->coords = (int(*)[2])aom_malloc(sizeof(*model->coords) * n);
  if (!model->coords) {
    aom_noise_model_free(model);
    return 0;
  }

  for (y = -lag; y <= 0; ++y) {
    const int max_x = y == 0 ? -1 : lag;
    for (x = -lag; x <= max_x; ++x) {
      switch (params.shape) {
        case AOM_NOISE_SHAPE_DIAMOND:
          if (abs(x) <= y + lag) {
            model->coords[i][0] = x;
            model->coords[i][1] = y;
            ++i;
          }
          break;
        case AOM_NOISE_SHAPE_SQUARE:
          model->coords[i][0] = x;
          model->coords[i][1] = y;
          ++i;
          break;
        default:
          fprintf(stderr, "Invalid shape\n");
          aom_noise_model_free(model);
          return 0;
      }
    }
  }
  assert(i == n);
  return 1;
}